

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O1

int32 __thiscall rw::PluginList::getPluginOffset(PluginList *this,uint32 id)

{
  LLLink *pLVar1;
  int32 in_EAX;
  LLLink *pLVar2;
  
  pLVar2 = (this->plugins).link.next;
  do {
    if (pLVar2 == &(this->plugins).link) {
      return -1;
    }
    pLVar1 = pLVar2 + -5;
    if (*(uint32 *)&pLVar1->next == id) {
      in_EAX = *(int32 *)&pLVar2[-6].prev;
    }
    pLVar2 = pLVar2->next;
  } while (*(uint32 *)&pLVar1->next != id);
  return in_EAX;
}

Assistant:

int32
PluginList::getPluginOffset(uint32 id)
{
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->id == id)
			return p->offset;
	}
	return -1;
}